

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void handle_error(cio_websocket *websocket,cio_error err,cio_websocket_status_code status_code,
                 char *reason)

{
  anon_struct_4_7_799a2f31_for_ws_flags aVar1;
  cio_error cVar2;
  
  aVar1 = (websocket->ws_private).ws_flags;
  if (((uint)aVar1 >> 0xc & 1) == 0) {
    *(ushort *)&(websocket->ws_private).ws_flags = aVar1._0_2_ | 0x1000;
    if (websocket->on_error != (_func_void_cio_websocket_ptr_cio_error_char_ptr *)0x0) {
      (*websocket->on_error)(websocket,err,reason);
    }
    abort_write_jobs(websocket);
    prepare_close_job_string
              (websocket,status_code,reason,(cio_websocket_write_handler_t)0x0,(void *)0x0,
               close_frame_written_immediate_close);
    cVar2 = enqueue_job(websocket,&(websocket->ws_private).write_close_job,
                        (((websocket->ws_private).write_close_job.wbh)->data).element.length);
    if (cVar2 != CIO_SUCCESS) {
      close((int)websocket);
      return;
    }
  }
  return;
}

Assistant:

static void handle_error(struct cio_websocket *websocket, enum cio_error err, enum cio_websocket_status_code status_code, const char *reason)
{
	if (websocket->ws_private.ws_flags.closed_by_error == 0U) {
		websocket->ws_private.ws_flags.closed_by_error = 1U;
		if (websocket->on_error != NULL) {
			websocket->on_error(websocket, err, reason);
		}

		abort_write_jobs(websocket);
		prepare_close_job_string(websocket, status_code, reason, NULL, NULL, close_frame_written_immediate_close);

		size_t length = cio_write_buffer_get_total_size(websocket->ws_private.write_close_job.wbh);
		if (enqueue_job(websocket, &websocket->ws_private.write_close_job, length) != CIO_SUCCESS) {
			close(websocket);
		}
	}
}